

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::MemoryPacking::optimizeSegmentOps::Optimizer::create(Optimizer *this)

{
  unique_ptr<Optimizer,_std::default_delete<Optimizer>_> local_20 [2];
  Optimizer *this_local;
  
  this_local = this;
  std::make_unique<wasm::MemoryPacking::optimizeSegmentOps(wasm::Module*)::Optimizer>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::MemoryPacking::optimizeSegmentOps(wasm::Module*)::Optimizer,std::default_delete<wasm::MemoryPacking::optimizeSegmentOps(wasm::Module*)::Optimizer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<Optimizer,_std::default_delete<Optimizer>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<Optimizer>();
    }